

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printfcpp.cpp
# Opt level: O2

BOOL Internal_ExtractFormatA
               (CPalThread *pthrCurrent,LPCSTR *Fmt,LPSTR Out,LPINT Flags,LPINT Width,
               LPINT Precision,LPINT Prefix,LPINT Type)

{
  byte *pbVar1;
  byte bVar2;
  int iVar3;
  size_t sVar4;
  char *pcVar5;
  int *piVar6;
  byte *pbVar7;
  BOOL BVar8;
  uint uVar9;
  long lVar10;
  byte *pbVar11;
  
  *Width = -1;
  *Precision = -1;
  *Flags = 0;
  *Prefix = -1;
  *Type = -1;
  pcVar5 = *Fmt;
  if (pcVar5 == (char *)0x0) {
    return 0;
  }
  if (*pcVar5 != '%') {
    return 0;
  }
  *Fmt = pcVar5 + 1;
  *Out = *pcVar5;
  sVar4 = strlen(*Fmt);
  pcVar5 = (char *)CorUnix::InternalMalloc(sVar4 + 1);
  if (pcVar5 != (char *)0x0) {
    do {
      pbVar11 = (byte *)Out + 1;
      pbVar1 = (byte *)*Fmt;
      bVar2 = *pbVar1;
      if (bVar2 == 0x20) {
        uVar9 = 8;
      }
      else if (bVar2 == 0x23) {
        uVar9 = 2;
      }
      else if (bVar2 == 0x30) {
        uVar9 = 4;
      }
      else {
        uVar9 = 1;
        if (bVar2 != 0x2d) {
          if (bVar2 != 0x2b) goto LAB_0030ca3a;
          uVar9 = 0x10;
        }
      }
      *Flags = *Flags | uVar9;
      *Fmt = (LPCSTR)(pbVar1 + 1);
      *pbVar11 = *pbVar1;
      Out = (LPSTR)pbVar11;
    } while( true );
  }
  if (PAL_InitializeChakraCoreCalled != false) {
    piVar6 = __errno_location();
    *piVar6 = 8;
    return 0;
  }
  goto LAB_0030cea4;
LAB_0030ca3a:
  if ((~*Flags & 5U) == 0) {
    *Flags = *Flags - 4;
    bVar2 = *pbVar1;
  }
  iVar3 = isdigit((uint)bVar2);
  if (iVar3 != 0) {
    lVar10 = 1;
    while (iVar3 = isdigit((uint)(byte)**Fmt), iVar3 != 0) {
      pcVar5[lVar10 + -1] = **Fmt;
      pbVar1 = (byte *)*Fmt;
      *Fmt = (LPCSTR)(pbVar1 + 1);
      ((byte *)Out)[lVar10] = *pbVar1;
      lVar10 = lVar10 + 1;
    }
    pcVar5[lVar10 + -1] = '\0';
    iVar3 = atoi(pcVar5);
    *Width = iVar3;
    if (-1 < iVar3) {
      pbVar11 = (byte *)Out + lVar10;
      goto LAB_0030cb2c;
    }
LAB_0030cc17:
    if (PAL_InitializeChakraCoreCalled != false) {
      piVar6 = __errno_location();
      *piVar6 = 0x54f;
      return 0;
    }
LAB_0030cea4:
    abort();
  }
  pbVar1 = (byte *)*Fmt;
  if (*pbVar1 == 0x2a) {
    *Width = -2;
    *Fmt = (LPCSTR)(pbVar1 + 1);
    ((byte *)Out)[1] = *pbVar1;
    pbVar11 = (byte *)Out + 2;
    iVar3 = isdigit((uint)(byte)**Fmt);
    if (iVar3 != 0) {
      *Width = -3;
      while (iVar3 = isdigit((uint)(byte)**Fmt), iVar3 != 0) {
        pbVar1 = (byte *)*Fmt;
        *Fmt = (LPCSTR)(pbVar1 + 1);
        *pbVar11 = *pbVar1;
        pbVar11 = pbVar11 + 1;
      }
    }
  }
LAB_0030cb2c:
  pbVar1 = (byte *)*Fmt;
  if (*pbVar1 == 0x2e) {
    *Fmt = (LPCSTR)(pbVar1 + 1);
    pbVar7 = pbVar11 + 1;
    *pbVar11 = *pbVar1;
    iVar3 = isdigit((uint)(byte)**Fmt);
    if (iVar3 == 0) {
      pbVar1 = (byte *)*Fmt;
      if (*pbVar1 == 0x2a) {
        *Precision = -2;
        *Fmt = (LPCSTR)(pbVar1 + 1);
        pbVar11[1] = *pbVar1;
        pbVar11 = pbVar11 + 2;
        iVar3 = isdigit((uint)(byte)**Fmt);
        if (iVar3 != 0) {
          *Precision = -4;
          while (iVar3 = isdigit((uint)(byte)**Fmt), iVar3 != 0) {
            pbVar1 = (byte *)*Fmt;
            *Fmt = (LPCSTR)(pbVar1 + 1);
            *pbVar11 = *pbVar1;
            pbVar11 = pbVar11 + 1;
          }
        }
      }
      else {
        *Precision = -3;
        pbVar11 = pbVar7;
      }
    }
    else {
      lVar10 = 0;
      while (iVar3 = isdigit((uint)(byte)**Fmt), iVar3 != 0) {
        pcVar5[lVar10] = **Fmt;
        pbVar1 = (byte *)*Fmt;
        *Fmt = (LPCSTR)(pbVar1 + 1);
        pbVar7[lVar10] = *pbVar1;
        lVar10 = lVar10 + 1;
      }
      pcVar5[lVar10] = '\0';
      iVar3 = atoi(pcVar5);
      *Precision = iVar3;
      if (iVar3 < 0) goto LAB_0030cc17;
      pbVar11 = pbVar7 + lVar10;
    }
  }
  pbVar1 = (byte *)*Fmt;
  bVar2 = *pbVar1;
  if (bVar2 == 0x70) {
    *Prefix = 3;
    bVar2 = *pbVar1;
  }
  if (bVar2 == 0x77) {
LAB_0030cc39:
    pbVar7 = pbVar1 + 1;
    *Fmt = (LPCSTR)pbVar7;
    bVar2 = pbVar1[1];
    if ((bVar2 | 0x10) == 0x73) {
      *Prefix = 2;
      bVar2 = *pbVar7;
    }
    if (bVar2 == 0x6c) {
      *Prefix = 3;
      pbVar7 = pbVar1 + 2;
      goto LAB_0030ccd6;
    }
  }
  else {
    if (bVar2 != 0x4c) {
      if (bVar2 != 0x68) {
        if (bVar2 == 0x6c) goto LAB_0030cc39;
        pbVar7 = pbVar1;
        if (bVar2 != 0x49) goto LAB_0030cd11;
        if (pbVar1[1] == 0x33) {
          if (pbVar1[2] == 0x32) {
            pbVar7 = pbVar1 + 3;
            goto LAB_0030ccd6;
          }
LAB_0030cd02:
          pbVar7 = pbVar1 + 1;
        }
        else {
          if ((pbVar1[1] != 0x36) || (pbVar1[2] != 0x34)) goto LAB_0030cd02;
          pbVar7 = pbVar1 + 3;
        }
        *Fmt = (LPCSTR)pbVar7;
        *Prefix = 3;
        goto LAB_0030cd11;
      }
      *Prefix = 1;
    }
    pbVar7 = pbVar1 + 1;
LAB_0030ccd6:
    *Fmt = (LPCSTR)pbVar7;
  }
LAB_0030cd11:
  bVar2 = *pbVar7;
  switch(bVar2) {
  case 99:
    goto switchD_0030cd2a_caseD_63;
  case 100:
  case 0x69:
  case 0x6f:
  case 0x75:
  case 0x78:
switchD_0030cd2a_caseD_64:
    *Type = 4;
    iVar3 = *Prefix;
    if (iVar3 == 3) {
      pbVar11[0] = 0x6c;
      pbVar11[1] = 0x6c;
      pbVar11 = pbVar11 + 2;
    }
    else {
      if (iVar3 == 2) {
        *pbVar11 = 0x6c;
      }
      else {
        if (iVar3 != 1) goto LAB_0030cda8;
        *pbVar11 = 0x68;
      }
      pbVar11 = pbVar11 + 1;
    }
LAB_0030cda8:
    pbVar7 = (byte *)*Fmt;
    goto LAB_0030cdca;
  case 0x65:
  case 0x66:
  case 0x67:
switchD_0030cd2a_caseD_65:
    *Type = 7;
LAB_0030cdca:
    *Fmt = (LPCSTR)(pbVar7 + 1);
    *pbVar11 = *pbVar7;
LAB_0030cdd6:
    pbVar11 = pbVar11 + 1;
    goto LAB_0030ce03;
  case 0x68:
  case 0x6a:
  case 0x6b:
  case 0x6c:
  case 0x6d:
  case 0x6e:
  case 0x70:
  case 0x71:
  case 0x72:
  case 0x74:
  case 0x76:
  case 0x77:
switchD_0030cd2a_caseD_68:
    if (bVar2 == 0x70) {
      *Type = 5;
      *Fmt = (LPCSTR)(pbVar7 + 1);
      if (*Prefix == 3) {
        if (*Precision == -1) {
          *Precision = 0x10;
          pbVar11[0] = 0x2e;
          pbVar11[1] = 0x31;
          pbVar11[2] = 0x36;
          pbVar11 = pbVar11 + 3;
        }
        pbVar11[0] = 0x6c;
        pbVar11[1] = 0x6c;
LAB_0030ce97:
        pbVar11 = pbVar11 + 2;
      }
      else if (*Precision == -1) {
        *Precision = 8;
        pbVar11[0] = 0x2e;
        pbVar11[1] = 0x38;
        goto LAB_0030ce97;
      }
      *pbVar11 = 0x58;
      goto LAB_0030cdd6;
    }
    if (bVar2 != 0x6e) {
      if (bVar2 != 0x47) {
        BVar8 = 0;
        goto LAB_0030ce06;
      }
      goto switchD_0030cd2a_caseD_65;
    }
    if (*Prefix == 1) {
      *pbVar11 = 0x68;
      pbVar11 = pbVar11 + 1;
      pbVar7 = (byte *)*Fmt;
    }
    *Fmt = (LPCSTR)(pbVar7 + 1);
    *pbVar11 = *pbVar7;
    pbVar11 = pbVar11 + 1;
    *Type = 6;
    goto LAB_0030ce03;
  case 0x73:
switchD_0030cd2a_caseD_73:
    *Type = 2;
    if (*Prefix != 1) {
      if (*pbVar7 == 0x53) {
        *Prefix = 2;
      }
      else if (*Prefix != 2) goto LAB_0030cde7;
      *pbVar11 = 0x6c;
      pbVar11 = pbVar11 + 1;
    }
LAB_0030cde7:
    *pbVar11 = 0x73;
    goto LAB_0030cdfd;
  }
  if (bVar2 == 0x58) goto switchD_0030cd2a_caseD_64;
  if (bVar2 == 0x45) goto switchD_0030cd2a_caseD_65;
  if (bVar2 == 0x53) goto switchD_0030cd2a_caseD_73;
  if (bVar2 != 0x43) goto switchD_0030cd2a_caseD_68;
switchD_0030cd2a_caseD_63:
  *Type = 1;
  if (*Prefix != 1) {
    if (*pbVar7 == 0x43) {
      *Prefix = 2;
    }
    else if (*Prefix != 2) goto LAB_0030cdf9;
    *pbVar11 = 0x6c;
    pbVar11 = pbVar11 + 1;
  }
LAB_0030cdf9:
  *pbVar11 = 99;
LAB_0030cdfd:
  pbVar11 = pbVar11 + 1;
  *Fmt = *Fmt + 1;
LAB_0030ce03:
  BVar8 = 1;
LAB_0030ce06:
  *pbVar11 = 0;
  CorUnix::InternalFree(pcVar5);
  return BVar8;
}

Assistant:

BOOL Internal_ExtractFormatA(CPalThread *pthrCurrent, LPCSTR *Fmt, LPSTR Out, LPINT Flags,
    LPINT Width, LPINT Precision, LPINT Prefix, LPINT Type)
{
    BOOL Result = FALSE;
    LPSTR TempStr;
    LPSTR TempStrPtr;

    *Width = WIDTH_DEFAULT;
    *Precision = PRECISION_DEFAULT;
    *Flags = PFF_NONE;
    *Prefix = PFF_PREFIX_DEFAULT;
    *Type = PFF_TYPE_DEFAULT;

    if (*Fmt && **Fmt == '%')
    {
        *Out++ = *(*Fmt)++;
    }
    else
    {
        return Result;
    }

    /* we'll never need a temp string longer than the original */
    TempStrPtr = TempStr = (LPSTR) InternalMalloc(strlen(*Fmt)+1);
    if (!TempStr)
    {
        ERROR("InternalMalloc failed\n");
        pthrCurrent->SetLastError(ERROR_NOT_ENOUGH_MEMORY);
        return Result;
    }

    /* parse flags */
    while (**Fmt && (**Fmt == '-' || **Fmt == '+' ||
           **Fmt == '0' || **Fmt == ' ' || **Fmt == '#'))
    {
        switch (**Fmt)
        {
        case '-':
            *Flags |= PFF_MINUS; break;
        case '+':
            *Flags |= PFF_PLUS; break;
        case '0':
            *Flags |= PFF_ZERO; break;
        case ' ':
            *Flags |= PFF_SPACE; break;
        case '#':
            *Flags |= PFF_POUND; break;
        }
            *Out++ = *(*Fmt)++;
    }
    /* '-' flag negates '0' flag */
    if ((*Flags & PFF_MINUS) && (*Flags & PFF_ZERO))
    {
        *Flags -= PFF_ZERO;
    }

    /* grab width specifier */
    if (isdigit((unsigned char) **Fmt))
    {
        TempStrPtr = TempStr;
        while (isdigit((unsigned char) **Fmt))
        {
            *TempStrPtr++ = **Fmt;
            *Out++ = *(*Fmt)++;
        }
        *TempStrPtr = 0; /* end string */
        *Width = atoi(TempStr);
        if (*Width < 0)
        {
            ERROR("atoi returned a negative value indicative of an overflow.\n");
            pthrCurrent->SetLastError(ERROR_INTERNAL_ERROR);
            return Result;
        }
    }
    else if (**Fmt == '*')
    {
        *Width = WIDTH_STAR;
        *Out++ = *(*Fmt)++;
        if (isdigit((unsigned char) **Fmt))
        {
            /* this is an invalid width because we have a * then a number */
            /* printf handles this by just printing the whole string */
            *Width = WIDTH_INVALID;
            while (isdigit((unsigned char) **Fmt))
            {
               *Out++ = *(*Fmt)++;
            }
        }
    }


    /* grab precision specifier */
    if (**Fmt == '.')
    {
        *Out++ = *(*Fmt)++;
        if (isdigit((unsigned char) **Fmt))
        {
            TempStrPtr = TempStr;
            while (isdigit((unsigned char) **Fmt))
            {
                *TempStrPtr++ = **Fmt;
                *Out++ = *(*Fmt)++;
            }
            *TempStrPtr = 0; /* end string */
            *Precision = atoi(TempStr);
            if (*Precision < 0)
            {
                ERROR("atoi returned a negative value indicative of an overflow.\n");
                pthrCurrent->SetLastError(ERROR_INTERNAL_ERROR);
                return Result;
            }
        }
        else if (**Fmt == '*')
        {
            *Precision = PRECISION_STAR;
            *Out++ = *(*Fmt)++;
            if (isdigit((unsigned char) **Fmt))
            {
                /* this is an invalid precision because we have a .* then a number */
                /* printf handles this by just printing the whole string */
                *Precision = PRECISION_INVALID;
                while (isdigit((unsigned char) **Fmt))
                {
                    *Out++ = *(*Fmt)++;
                }
            }
        }
        else
        {
            *Precision = PRECISION_DOT;
        }
    }

#ifdef BIT64
    if (**Fmt == 'p')
    {
        *Prefix = PFF_PREFIX_LONGLONG;
    }
#endif
    if ((*Fmt)[0] == 'I')
    {
        /* grab prefix of 'I64' for __int64 */
        if ((*Fmt)[1] == '6' && (*Fmt)[2] == '4')
        {
            /* convert to 'll' so that Unix snprintf can handle it */
            *Fmt += 3;
            *Prefix = PFF_PREFIX_LONGLONG;
        }
        /* grab prefix of 'I32' for __int32 */
        else if ((*Fmt)[1] == '3' && (*Fmt)[2] == '2')
        {
            *Fmt += 3;
        }
        else
        {
            ++(*Fmt);
    #ifdef BIT64
            /* convert to 'll' so that Unix snprintf can handle it */
            *Prefix = PFF_PREFIX_LONGLONG;
    #endif
        }
    }
    /* grab a prefix of 'h' */
    else if (**Fmt == 'h')
    {
        *Prefix = PFF_PREFIX_SHORT;
        ++(*Fmt);
    }
    /* grab prefix of 'l' or the undocumented 'w' (at least in MSDN) */
    else if (**Fmt == 'l' || **Fmt == 'w')
    {
        ++(*Fmt);
#ifdef BIT64
        // Only want to change the prefix on 64 bit when printing characters.
        if (**Fmt == 'c' || **Fmt == 's')
#endif
        {
            *Prefix = PFF_PREFIX_LONG;
        }
        if (**Fmt == 'l')
        {
            *Prefix = PFF_PREFIX_LONGLONG;
            ++(*Fmt);
        }
    }
    else if (**Fmt == 'L')
    {
        /* a prefix of 'L' seems to be ignored */
        ++(*Fmt);
    }

    /* grab type 'c' */
    if (**Fmt == 'c' || **Fmt == 'C')
    {
        *Type = PFF_TYPE_CHAR;
        if (*Prefix != PFF_PREFIX_SHORT && **Fmt == 'C')
        {
            *Prefix = PFF_PREFIX_LONG; /* give it a wide prefix */
        }
        if (*Prefix == PFF_PREFIX_LONG)
        {
            *Out++ = 'l';
        }
        *Out++ = 'c';
        ++(*Fmt);
        Result = TRUE;
    }
    /* grab type 's' */
    else if (**Fmt == 's' || **Fmt == 'S')
    {
        *Type = PFF_TYPE_STRING;
        if (*Prefix != PFF_PREFIX_SHORT && **Fmt == 'S')
        {
            *Prefix = PFF_PREFIX_LONG; /* give it a wide prefix */
        }
        if (*Prefix == PFF_PREFIX_LONG)
        {
            *Out++ = 'l';
        }
        *Out++ = 's';
        ++(*Fmt);
        Result = TRUE;
    }
    /* grab int types */
    else if (**Fmt == 'd' || **Fmt == 'i' || **Fmt == 'o' ||
             **Fmt == 'u' || **Fmt == 'x' || **Fmt == 'X')
    {
        *Type = PFF_TYPE_INT;
        if (*Prefix == PFF_PREFIX_SHORT)
        {
            *Out++ = 'h';
        }
        else if (*Prefix == PFF_PREFIX_LONG)
        {
            *Out++ = 'l';
        }
        else if (*Prefix == PFF_PREFIX_LONGLONG)
        {
            *Out++ = 'l';
            *Out++ = 'l';
        }
        *Out++ = *(*Fmt)++;
        Result = TRUE;
    }
    else if (**Fmt == 'e' || **Fmt == 'E' || **Fmt == 'f' ||
             **Fmt == 'g' || **Fmt == 'G')
    {
        /* we can safely ignore the prefixes and only add the type*/
        *Type = PFF_TYPE_FLOAT;
        *Out++ = *(*Fmt)++;
        Result = TRUE;
    }
    else if (**Fmt == 'n')
    {
        if (*Prefix == PFF_PREFIX_SHORT)
        {
            *Out++ = 'h';
        }
        *Out++ = *(*Fmt)++;
        *Type = PFF_TYPE_N;
        Result = TRUE;
    }
    else if (**Fmt == 'p')
    {
        *Type = PFF_TYPE_P;
        (*Fmt)++;

        if (*Prefix == PFF_PREFIX_LONGLONG)
        {
            if (*Precision == PRECISION_DEFAULT)
            {
                *Precision = 16;
                *Out++ = '.';
                *Out++ = '1';
                *Out++ = '6';
            }
            /* native *printf does not support %I64p
               (actually %llp), so we need to cheat a little bit */
            *Out++ = 'l';
            *Out++ = 'l';
        }
        else
        {
            if (*Precision == PRECISION_DEFAULT)
            {
                *Precision = 8;
                *Out++ = '.';
                *Out++ = '8';
            }
        }
        *Out++ = 'X';
        Result = TRUE;
    }

    *Out = 0;  /* end the string */
    InternalFree(TempStr);
    return Result;
}